

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_aggsig_sign_single
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,uchar *seckey32,uchar *secnonce32,
              uchar *extra32,secp256k1_pubkey *pubnonce_for_e,secp256k1_pubkey *pubnonce_total,
              secp256k1_pubkey *pubkey_for_e,uchar *seed)

{
  uchar *puVar1;
  int iVar2;
  int overflow;
  uchar *local_318;
  uchar *local_310;
  int retry;
  secp256k1_scalar secnonce;
  secp256k1_scalar local_2e0;
  secp256k1_scalar tmp_scalar;
  secp256k1_scalar sighash;
  secp256k1_ge tmp_ge;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej pubnonce_j;
  secp256k1_pubkey pub_tmp;
  secp256k1_ge final;
  secp256k1_ge total_tmp_ge;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
LAB_001114fc:
    iVar2 = 0;
  }
  else {
    local_318 = sig64;
    local_310 = msg32;
    if (secnonce32 == (uchar *)0x0) {
      secp256k1_rfc6979_hmac_sha256_initialize(&rng,seed,0x20);
      iVar2 = secp256k1_aggsig_generate_nonce_single(ctx,&secnonce,&pubnonce_j,&rng);
      if (iVar2 == 0) goto LAB_001114fc;
      rng.k[0x10] = '\0';
      rng.k[0x11] = '\0';
      rng.k[0x12] = '\0';
      rng.k[0x13] = '\0';
      rng.k[0x14] = '\0';
      rng.k[0x15] = '\0';
      rng.k[0x16] = '\0';
      rng.k[0x17] = '\0';
      rng.k[0x18] = '\0';
      rng.k[0x19] = '\0';
      rng.k[0x1a] = '\0';
      rng.k[0x1b] = '\0';
      rng.k[0x1c] = '\0';
      rng.k[0x1d] = '\0';
      rng.k[0x1e] = '\0';
      rng.k[0x1f] = '\0';
      rng.k[0] = '\0';
      rng.k[1] = '\0';
      rng.k[2] = '\0';
      rng.k[3] = '\0';
      rng.k[4] = '\0';
      rng.k[5] = '\0';
      rng.k[6] = '\0';
      rng.k[7] = '\0';
      rng.k[8] = '\0';
      rng.k[9] = '\0';
      rng.k[10] = '\0';
      rng.k[0xb] = '\0';
      rng.k[0xc] = '\0';
      rng.k[0xd] = '\0';
      rng.k[0xe] = '\0';
      rng.k[0xf] = '\0';
      rng.v[0x10] = '\0';
      rng.v[0x11] = '\0';
      rng.v[0x12] = '\0';
      rng.v[0x13] = '\0';
      rng.v[0x14] = '\0';
      rng.v[0x15] = '\0';
      rng.v[0x16] = '\0';
      rng.v[0x17] = '\0';
      rng.v[0x18] = '\0';
      rng.v[0x19] = '\0';
      rng.v[0x1a] = '\0';
      rng.v[0x1b] = '\0';
      rng.v[0x1c] = '\0';
      rng.v[0x1d] = '\0';
      rng.v[0x1e] = '\0';
      rng.v[0x1f] = '\0';
      rng.v[0] = '\0';
      rng.v[1] = '\0';
      rng.v[2] = '\0';
      rng.v[3] = '\0';
      rng.v[4] = '\0';
      rng.v[5] = '\0';
      rng.v[6] = '\0';
      rng.v[7] = '\0';
      rng.v[8] = '\0';
      rng.v[9] = '\0';
      rng.v[10] = '\0';
      rng.v[0xb] = '\0';
      rng.v[0xc] = '\0';
      rng.v[0xd] = '\0';
      rng.v[0xe] = '\0';
      rng.v[0xf] = '\0';
      rng.retry = 0;
      secp256k1_ge_set_gej(&tmp_ge,&pubnonce_j);
    }
    else {
      secp256k1_scalar_set_b32(&secnonce,secnonce32,&retry);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&pubnonce_j,&secnonce);
      secp256k1_ge_set_gej(&tmp_ge,&pubnonce_j);
      if (pubnonce_total == (secp256k1_pubkey *)0x0) {
        iVar2 = secp256k1_gej_has_quad_y_var(&pubnonce_j);
        if (iVar2 == 0) {
          secp256k1_scalar_negate(&secnonce,&secnonce);
          secp256k1_gej_neg(&pubnonce_j,&pubnonce_j);
          secp256k1_ge_neg(&tmp_ge,&tmp_ge);
        }
      }
      else {
        secp256k1_gej_set_infinity((secp256k1_gej *)&rng);
        secp256k1_pubkey_load(ctx,&total_tmp_ge,pubnonce_total);
        secp256k1_gej_add_ge((secp256k1_gej *)&rng,(secp256k1_gej *)&rng,&total_tmp_ge);
        iVar2 = secp256k1_gej_has_quad_y_var((secp256k1_gej *)&rng);
        if (iVar2 == 0) {
          secp256k1_scalar_negate(&secnonce,&secnonce);
        }
      }
    }
    secp256k1_fe_normalize(&tmp_ge.x);
    if (pubnonce_for_e == (secp256k1_pubkey *)0x0) {
      pubnonce_for_e = &pub_tmp;
      secp256k1_pubkey_save(pubnonce_for_e,&tmp_ge);
    }
    secp256k1_compute_sighash_single(ctx,&sighash,pubnonce_for_e,pubkey_for_e,local_310);
    secp256k1_scalar_set_b32(&local_2e0,seckey32,&overflow);
    iVar2 = 0;
    if (overflow == 0) {
      secp256k1_scalar_mul(&local_2e0,&local_2e0,&sighash);
      secp256k1_scalar_add(&local_2e0,&local_2e0,&secnonce);
      if (extra32 != (uchar *)0x0) {
        secp256k1_scalar_set_b32(&tmp_scalar,extra32,&overflow);
        if (overflow != 0) {
          return 0;
        }
        secp256k1_scalar_add(&local_2e0,&local_2e0,&tmp_scalar);
      }
      secp256k1_ge_set_gej(&final,&pubnonce_j);
      secp256k1_fe_normalize_var(&final.x);
      puVar1 = local_318;
      secp256k1_fe_get_b32(local_318,&final.x);
      secp256k1_scalar_get_b32(puVar1 + 0x20,&local_2e0);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_aggsig_sign_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char *msg32,
    const unsigned char *seckey32,
    const unsigned char* secnonce32,
    const unsigned char* extra32,
    const secp256k1_pubkey* pubnonce_for_e,
    const secp256k1_pubkey* pubnonce_total,
    const secp256k1_pubkey* pubkey_for_e,
    const unsigned char* seed){

    secp256k1_scalar sighash;
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar sec;
    secp256k1_ge tmp_ge;
    secp256k1_ge total_tmp_ge;
    secp256k1_gej pubnonce_j;
    secp256k1_gej pubnonce_total_j;
    secp256k1_pubkey pub_tmp;

    secp256k1_scalar secnonce;
    secp256k1_ge final;
    int overflow;
    int retry;
    secp256k1_scalar tmp_scalar;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(seed != NULL);

    /* generate nonce if needed */
    if (secnonce32==NULL){
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 32);
        if (secp256k1_aggsig_generate_nonce_single(ctx, &secnonce, &pubnonce_j, &rng) == 0){
            return 0;
        }
        secp256k1_rfc6979_hmac_sha256_finalize(&rng);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);
    } else {
        secp256k1_scalar_set_b32(&secnonce, secnonce32, &retry);
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pubnonce_j, &secnonce);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);

        if (pubnonce_total!=NULL) {
            secp256k1_gej_set_infinity(&pubnonce_total_j);
            secp256k1_pubkey_load(ctx, &total_tmp_ge, pubnonce_total);
            secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &total_tmp_ge);
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
            }
        } else {
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
                secp256k1_gej_neg(&pubnonce_j, &pubnonce_j);
                secp256k1_ge_neg(&tmp_ge, &tmp_ge);
            }
        }
    }

    secp256k1_fe_normalize(&tmp_ge.x);

    /* compute signature hash (in the simple case just message+pubnonce+pubkey) */
    if (pubnonce_for_e != NULL) {
        secp256k1_compute_sighash_single(ctx, &sighash, pubnonce_for_e, pubkey_for_e, msg32);
    } else {
        secp256k1_pubkey_save(&pub_tmp, &tmp_ge);
        secp256k1_compute_sighash_single(ctx, &sighash, &pub_tmp, pubkey_for_e, msg32);
    }
    /* calculate signature */
    secp256k1_scalar_set_b32(&sec, seckey32, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&sec);
        return 0;
    }

    secp256k1_scalar_mul(&sec, &sec, &sighash);
    secp256k1_scalar_add(&sec, &sec, &secnonce);

    if (extra32 != NULL) {
        /* add extra scalar */
        secp256k1_scalar_set_b32(&tmp_scalar, extra32, &overflow);
        if (overflow) {
            secp256k1_scalar_clear(&sec);
            return 0;
        }
        secp256k1_scalar_add(&sec, &sec, &tmp_scalar);
    }

    /* finalize */
    secp256k1_ge_set_gej(&final, &pubnonce_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &sec);

    secp256k1_scalar_clear(&sec);

    return 1;
}